

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O0

void __thiscall YdiskRestClient::set_oauth_token(YdiskRestClient *this,char *token)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  iterator local_60;
  size_type local_58;
  allocator local_39;
  undefined1 local_38 [8];
  string header_token;
  char *token_local;
  YdiskRestClient *this_local;
  
  header_token.field_2._8_8_ = token;
  if (token != (char *)0x0) {
    this->token = token;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_38,"OAuth ",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    std::__cxx11::string::operator+=((string *)local_38,(char *)header_token.field_2._8_8_);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_a0,(char (*) [14])"Authorization",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    local_60 = &local_a0;
    local_58 = 1;
    __l._M_len = 1;
    __l._M_array = local_60;
    std::
    multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(&this->headers,__l);
    local_c0 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_60;
    do {
      local_c0 = local_c0 + -1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(local_c0);
    } while (local_c0 != &local_a0);
    std::__cxx11::string::~string((string *)local_38);
    return;
  }
  __assert_fail("token != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ivanenko[P]ydisk_commander/restclient.cpp"
                ,0x79,"void YdiskRestClient::set_oauth_token(const char *)");
}

Assistant:

void YdiskRestClient::set_oauth_token(const char *token)
{
    assert(token != NULL);
    this->token = token;

    std::string header_token = "OAuth ";
    header_token += token;
    headers = { {"Authorization", header_token} };
}